

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_over_ip.cpp
# Opt level: O2

void __thiscall
cppcms::impl::cache_over_ip::cache_over_ip
          (cache_over_ip *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ips,vector<int,_std::allocator<int>_> *ports,intrusive_ptr<cppcms::impl::base_cache> *l1)

{
  base_cache *pbVar1;
  
  (this->super_base_cache)._vptr_base_cache = (_func_int **)&PTR_fetch_002b8268;
  booster::thread_specific_ptr<cppcms::impl::tcp_cache>::thread_specific_ptr(&this->tcp_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ips_,ips);
  std::vector<int,_std::allocator<int>_>::vector(&this->ports_,ports);
  pbVar1 = l1->p_;
  (this->l1_).p_ = pbVar1;
  if (pbVar1 != (base_cache *)0x0) {
    (*pbVar1->_vptr_base_cache[6])();
  }
  booster::atomic_counter::atomic_counter(&this->refs_,0);
  return;
}

Assistant:

cache_over_ip(std::vector<std::string> ips,std::vector<int> ports,booster::intrusive_ptr<base_cache> l1) :
			ips_(ips),
			ports_(ports),
			l1_(l1),
			refs_(0)
		{
		}